

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMap.c
# Opt level: O2

If_Obj_t * Lpk_MapPrimeInternal(If_Man_t *pIfMan,Kit_Graph_t *pGraph)

{
  uint uVar1;
  Kit_Node_t *pKVar2;
  uint uVar3;
  If_Obj_t *pIVar4;
  long lVar5;
  undefined1 *puVar6;
  anon_union_8_2_00c7e208_for_Kit_Node_t__2 *paVar7;
  ulong uVar8;
  
  if (pGraph->fConst == 0) {
    uVar8 = (ulong)(uint)pGraph->nLeaves;
    uVar3 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    if (uVar3 < (uint)pGraph->nLeaves) {
      paVar7 = &pGraph->pNodes[uVar3].field_2;
    }
    else {
      lVar5 = uVar8 * 0x18;
      puVar6 = (undefined1 *)0x0;
      for (; (long)uVar8 < (long)pGraph->nSize; uVar8 = uVar8 + 1) {
        pKVar2 = pGraph->pNodes;
        puVar6 = &(pKVar2->eEdge0).field_0x0 + lVar5;
        uVar3 = *(uint *)(&(pKVar2->eEdge0).field_0x0 + lVar5);
        uVar1 = *(uint *)(&(pKVar2->eEdge1).field_0x0 + lVar5);
        pIVar4 = If_ManCreateAnd(pIfMan,(If_Obj_t *)
                                        ((ulong)((pKVar2[uVar3 >> 1 & 0x3fffffff].field_2.iFunc ^
                                                 uVar3) & 1) |
                                        (ulong)pKVar2[uVar3 >> 1 & 0x3fffffff].field_2.pFunc &
                                        0xfffffffffffffffe),
                                 (If_Obj_t *)
                                 ((ulong)((pKVar2[uVar1 >> 1 & 0x3fffffff].field_2.iFunc ^ uVar1) &
                                         1) |
                                 (ulong)pKVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc &
                                 0xfffffffffffffffe));
        *(If_Obj_t **)((long)&pKVar2->field_2 + lVar5) = pIVar4;
        lVar5 = lVar5 + 0x18;
      }
      paVar7 = (anon_union_8_2_00c7e208_for_Kit_Node_t__2 *)(puVar6 + 8);
    }
  }
  else {
    paVar7 = (anon_union_8_2_00c7e208_for_Kit_Node_t__2 *)&pIfMan->pConst1;
  }
  return (If_Obj_t *)paVar7->pFunc;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
If_Obj_t * Lpk_MapPrimeInternal( If_Man_t * pIfMan, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    If_Obj_t * pAnd0, * pAnd1;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return If_ManConst1(pIfMan);
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return (If_Obj_t *)Kit_GraphVar(pGraph)->pFunc;
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = (If_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc; 
        pAnd1 = (If_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc; 
        pNode->pFunc = If_ManCreateAnd( pIfMan, 
            If_NotCond( If_Regular(pAnd0), If_IsComplement(pAnd0) ^ pNode->eEdge0.fCompl ), 
            If_NotCond( If_Regular(pAnd1), If_IsComplement(pAnd1) ^ pNode->eEdge1.fCompl ) );
    }
    return (If_Obj_t *)pNode->pFunc;
}